

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O3

double hdr_stddev(hdr_histogram *h)

{
  long lVar1;
  double dVar2;
  double dVar3;
  _Bool _Var4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  int64_t iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  hdr_iter iter;
  double local_a0;
  hdr_iter local_90;
  
  dVar2 = hdr_mean(h);
  local_90.counts_index = -1;
  iVar8 = h->total_count;
  local_90.count = 0;
  local_90.cumulative_count = 0;
  local_90.value = 0;
  local_90.highest_equivalent_value = 0;
  local_90.value_iterated_from = 0;
  local_90.value_iterated_to = 0;
  local_90._next_fp = all_values_iter_next;
  local_90.h = h;
  local_90.total_count = iVar8;
  _Var4 = all_values_iter_next(&local_90);
  uVar9 = 0;
  uVar10 = 0;
  if (_Var4) {
    local_a0 = 0.0;
    do {
      if (local_90.count != 0) {
        uVar7 = h->sub_bucket_mask | local_90.value;
        lVar1 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        bVar6 = 0x3f - (((byte)lVar1 ^ 0x3f) + (char)h->sub_bucket_half_count_magnitude);
        iVar5 = (int)(local_90.value >> (bVar6 & 0x3f));
        dVar3 = (double)(((1L << ((h->sub_bucket_count <= iVar5) + bVar6 & 0x3f)) >> 1) +
                        ((long)iVar5 << (bVar6 & 0x3f))) - dVar2;
        local_a0 = local_a0 + (double)local_90.count * dVar3 * dVar3;
      }
      _Var4 = (*local_90._next_fp)(&local_90);
    } while (_Var4);
    iVar8 = h->total_count;
    uVar9 = SUB84(local_a0,0);
    uVar10 = (undefined4)((ulong)local_a0 >> 0x20);
  }
  dVar2 = (double)CONCAT44(uVar10,uVar9) / (double)iVar8;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  return dVar2;
}

Assistant:

double hdr_stddev(const struct hdr_histogram* h)
{
    double mean = hdr_mean(h);
    double geometric_dev_total = 0.0;

    struct hdr_iter iter;
    hdr_iter_init(&iter, h);

    while (hdr_iter_next(&iter))
    {
        if (0 != iter.count)
        {
            double dev = (hdr_median_equivalent_value(h, iter.value) * 1.0) - mean;
            geometric_dev_total += (dev * dev) * iter.count;
        }
    }

    return sqrt(geometric_dev_total / h->total_count);
}